

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization_unpack.h
# Opt level: O3

void serialization::
     serialize_unpack<char_const*const*&,serialization::xml_oarchive,std::map<std::__cxx11::string,Person,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Person>>>const&,std::vector<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>,std::allocator<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>const&>
               (char ***arg,xml_oarchive *ar,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person>_>_>
               *front,vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                      *next)

{
  _Base_ptr p_Var1;
  char **ppcVar2;
  _Base_ptr p_Var3;
  xml_node<char> *pxVar4;
  _Rb_tree_header *p_Var5;
  
  xml_oarchive::save_key_start(ar,**arg);
  xml_oarchive::save_sequence_start
            (ar,(size_type)(front->_M_t)._M_impl.super__Rb_tree_header._M_node_count);
  p_Var3 = (front->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var5 = &(front->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 == p_Var5) {
    pxVar4 = ar->current_;
  }
  else {
    do {
      xml_oarchive::save_sequence_item_start(ar);
      xml_oarchive::save_key_start(ar,"first");
      pxVar4 = ar->current_;
      p_Var1 = p_Var3[1]._M_parent;
      (pxVar4->super_xml_base<char>).m_value = *(char **)(p_Var3 + 1);
      (pxVar4->super_xml_base<char>).m_value_size = (size_t)p_Var1;
      ar->current_ = (pxVar4->super_xml_base<char>).m_parent;
      xml_oarchive::save_key_start(ar,"second");
      Person::serialize_impl<serialization::xml_oarchive>((Person *)(p_Var3 + 2),ar);
      pxVar4 = (((ar->current_->super_xml_base<char>).m_parent)->super_xml_base<char>).m_parent;
      ar->current_ = pxVar4;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var5);
  }
  ar->current_ = (((pxVar4->super_xml_base<char>).m_parent)->super_xml_base<char>).m_parent;
  ppcVar2 = *arg;
  *arg = ppcVar2 + 1;
  xml_oarchive::save_key_start(ar,ppcVar2[1]);
  serialize_container_helper<serialization::xml_oarchive,std::vector<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>,std::allocator<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>>
            (ar,next);
  ar->current_ = (ar->current_->super_xml_base<char>).m_parent;
  *arg = *arg + 1;
  return;
}

Assistant:

inline void serialize_unpack(Argument && arg, Archive & ar, T && front, Args && ... next)
{
	serialization_trace trace(__func__, __FILE__, __LINE__);

    auto key = *arg;
    ar.save_key_start(key);
    serialize_helper(ar, front);
    ar.save_key_end(key);

    serialize_unpack(++arg, ar, std::forward<Args>(next)...);
}